

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDebug.cpp
# Opt level: O0

HighsDebugStatus __thiscall HEkk::debugBasisConsistent(HEkk *this)

{
  uint uVar1;
  HighsDebugStatus HVar2;
  vector<signed_char,_std::allocator<signed_char>_> *__x;
  size_type sVar3;
  uint *puVar4;
  reference pvVar5;
  long in_RDI;
  HighsInt flag;
  HighsInt iCol;
  HighsInt iRow;
  vector<signed_char,_std::allocator<signed_char>_> localNonbasicFlag;
  bool right_size;
  SimplexBasis *basis;
  HighsLp *lp;
  HighsOptions *options;
  HighsDebugStatus return_status;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  uint local_54;
  vector<signed_char,_std::allocator<signed_char>_> local_50;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  vector<signed_char,_std::allocator<signed_char>_> *this_00;
  HighsDebugStatus local_14;
  HighsDebugStatus local_4;
  
  if (*(int *)(*(long *)(in_RDI + 8) + 0x15c) < 1) {
    local_4 = kNotChecked;
  }
  else {
    local_14 = kOk;
    this_00 = *(vector<signed_char,_std::allocator<signed_char>_> **)(in_RDI + 8);
    __x = (vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0x2198);
    HVar2 = debugNonbasicFlagConsistent
                      ((HEkk *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
    if (HVar2 == kLogicalError) {
      highsLogDev((HighsLogOptions *)
                  &this_00[0x25].super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish,kError,"nonbasicFlag inconsistent\n");
      local_14 = kLogicalError;
    }
    sVar3 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2978));
    if ((int)sVar3 !=
        *(int *)((long)&(__x->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl
                        .super__Vector_impl_data._M_start + 4)) {
      highsLogDev((HighsLogOptions *)
                  &this_00[0x25].super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish,kError,"basicIndex size error\n");
      local_14 = kLogicalError;
    }
    std::vector<signed_char,_std::allocator<signed_char>_>::vector(this_00,__x);
    for (local_54 = 0;
        (int)local_54 <
        *(int *)((long)&(__x->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl
                        .super__Vector_impl_data._M_start + 4); local_54 = local_54 + 1) {
      puVar4 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2978),
                                  (long)(int)local_54);
      uVar1 = *puVar4;
      pvVar5 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                         (&local_50,(long)(int)uVar1);
      in_stack_ffffffffffffffa4 = (int)*pvVar5;
      pvVar5 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                         (&local_50,(long)(int)uVar1);
      *pvVar5 = -1;
      if (in_stack_ffffffffffffffa4 != 0) {
        if (in_stack_ffffffffffffffa4 == 1) {
          highsLogDev((HighsLogOptions *)
                      &this_00[0x25].super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish,kError,
                      "Entry basicIndex_[%d] = %d is not basic\n",(ulong)local_54,(ulong)uVar1);
        }
        else {
          highsLogDev((HighsLogOptions *)
                      &this_00[0x25].super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish,kError,
                      "Entry basicIndex_[%d] = %d is already basic\n",(ulong)local_54,(ulong)uVar1);
        }
        local_14 = kLogicalError;
      }
    }
    local_4 = local_14;
    std::vector<signed_char,_std::allocator<signed_char>_>::~vector
              ((vector<signed_char,_std::allocator<signed_char>_> *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  }
  return local_4;
}

Assistant:

HighsDebugStatus HEkk::debugBasisConsistent() const {
  // Cheap analysis of a Simplex basis, checking vector sizes, numbers
  // of basic/nonbasic variables and non-repetition of basic variables
  if (this->options_->highs_debug_level < kHighsDebugLevelCheap)
    return HighsDebugStatus::kNotChecked;
  HighsDebugStatus return_status = HighsDebugStatus::kOk;
  const HighsOptions& options = *(this->options_);
  const HighsLp& lp = this->lp_;
  const SimplexBasis& basis = this->basis_;
  // Check consistency of nonbasicFlag
  if (this->debugNonbasicFlagConsistent() == HighsDebugStatus::kLogicalError) {
    highsLogDev(options.log_options, HighsLogType::kError,
                "nonbasicFlag inconsistent\n");
    return_status = HighsDebugStatus::kLogicalError;
  }
  const bool right_size = (HighsInt)basis.basicIndex_.size() == lp.num_row_;
  // Check consistency of basicIndex
  if (!right_size) {
    highsLogDev(options.log_options, HighsLogType::kError,
                "basicIndex size error\n");
    assert(right_size);
    return_status = HighsDebugStatus::kLogicalError;
  }
  // Use localNonbasicFlag so that duplicate entries in basicIndex can
  // be spotted
  vector<int8_t> localNonbasicFlag = basis.nonbasicFlag_;
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    HighsInt iCol = basis.basicIndex_[iRow];
    HighsInt flag = localNonbasicFlag[iCol];
    // Indicate that this column has been found in basicIndex
    localNonbasicFlag[iCol] = -1;
    if (flag) {
      // Nonzero value for localNonbasicFlag entry means that column is either
      if (flag == kNonbasicFlagTrue) {
        // Nonbasic...
        highsLogDev(options.log_options, HighsLogType::kError,
                    "Entry basicIndex_[%" HIGHSINT_FORMAT
                    "] = %" HIGHSINT_FORMAT " is not basic\n",
                    iRow, iCol);
      } else {
        // .. or is -1 since it has already been found in basicIndex
        highsLogDev(options.log_options, HighsLogType::kError,
                    "Entry basicIndex_[%" HIGHSINT_FORMAT
                    "] = %" HIGHSINT_FORMAT " is already basic\n",
                    iRow, iCol);
        assert(flag == -1);
      }
      assert(!flag);
      return_status = HighsDebugStatus::kLogicalError;
    }
  }
  return return_status;
}